

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  value_type vVar3;
  key_type kVar4;
  value_type vVar5;
  key_type kVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht;
  AssertionResult gtest_ar;
  size_type old_bucket_count;
  key_type *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  char *in_stack_fffffffffffffd78;
  int line;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  uint i;
  undefined8 in_stack_fffffffffffffd88;
  Type TVar7;
  key_equal *eql;
  AssertHelper *in_stack_fffffffffffffd90;
  hasher *hf;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_00;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffda0;
  Message *in_stack_fffffffffffffdd8;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffde0;
  AssertionResult local_210;
  key_type local_1fc;
  value_type local_1d0;
  key_type local_1cc;
  value_type local_1a0;
  key_type local_19c;
  undefined4 local_184;
  size_type local_180;
  AssertionResult local_178;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_168;
  hasher local_158;
  key_equal local_14c [15];
  size_type local_98;
  AssertionResult local_90;
  key_type local_7c;
  value_type local_50;
  key_type local_4c;
  value_type local_1c;
  size_type local_18;
  key_type local_c;
  
  TVar7 = (Type)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                        (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                    in_stack_fffffffffffffd58);
  local_18 = google::
             BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xffbba9);
  local_1c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
  local_4c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
         );
  local_50 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
  local_7c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
         );
  local_98 = google::
             BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xffbc9f);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffd78,
             (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd90);
    in_stack_fffffffffffffda0 =
         (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xffbd06);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd90,TVar7,
               (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0xffbd63);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xffbdd4);
  eql = local_14c;
  i = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  hf = &local_158;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  this_00 = &local_168;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_00,i,(int *)(ulong)i);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_stack_fffffffffffffda0,(size_type)this_00,hf,eql,
             (allocator_type *)CONCAT44(i,in_stack_fffffffffffffd80));
  TVar7 = (Type)((ulong)eql >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_168);
  local_180 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xffbe57);
  local_184 = 0x20;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            (in_stack_fffffffffffffd78,
             (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (uint *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar1) {
    testing::Message::Message((Message *)hf);
    in_stack_fffffffffffffd78 =
         testing::AssertionResult::failure_message((AssertionResult *)0xffbf1c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hf,TVar7,(char *)CONCAT44(i,in_stack_fffffffffffffd80),
               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0xffbf79);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xffbfea);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  local_19c = kVar2;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                    in_stack_fffffffffffffd58);
  local_18 = google::
             BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xffc02e);
  vVar3 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  local_1a0 = vVar3;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
  kVar4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  local_1cc = kVar4;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
         );
  vVar5 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  local_1d0 = vVar5;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
  kVar6 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  local_1fc = kVar6;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(kVar6,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0xffc12f);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffd78,(char *)CONCAT44(kVar2,vVar3),
             (unsigned_long *)CONCAT44(kVar4,vVar5),
             (unsigned_long *)CONCAT44(kVar6,in_stack_fffffffffffffd60));
  line = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!bVar1) {
    testing::Message::Message((Message *)hf);
    testing::AssertionResult::failure_message((AssertionResult *)0xffc1aa);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hf,TVar7,(char *)CONCAT44(i,in_stack_fffffffffffffd80),line,
               (char *)CONCAT44(kVar2,vVar3));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(kVar6,in_stack_fffffffffffffd60));
    testing::Message::~Message((Message *)0xffc205);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xffc270);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xffc27d);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}